

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

char * luaX_token2str(LexState *ls,int token)

{
  LexState *local_30;
  char *s;
  int token_local;
  LexState *ls_local;
  
  if (token < 0x101) {
    if ((""[token + 1] & 4) == 0) {
      local_30 = (LexState *)luaO_pushfstring(ls->L,"char(%d)",(ulong)(uint)token);
    }
    else {
      local_30 = (LexState *)luaO_pushfstring(ls->L,"\'%c\'",(ulong)(uint)token);
    }
    ls_local = local_30;
  }
  else {
    ls_local = (LexState *)luaX_tokens[token + -0x101];
    if (token < 0x11e) {
      ls_local = (LexState *)luaO_pushfstring(ls->L,"\'%s\'",ls_local);
    }
  }
  return (char *)ls_local;
}

Assistant:

const char *luaX_token2str (LexState *ls, int token) {
  if (token < FIRST_RESERVED) {  /* single-byte symbols? */
    lua_assert(token == cast(unsigned char, token));
    return (lisprint(token)) ? luaO_pushfstring(ls->L, LUA_QL("%c"), token) :
                              luaO_pushfstring(ls->L, "char(%d)", token);
  }
  else {
    const char *s = luaX_tokens[token - FIRST_RESERVED];
    if (token < TK_EOS)  /* fixed format (symbols and reserved words)? */
      return luaO_pushfstring(ls->L, LUA_QS, s);
    else  /* names, strings, and numerals */
      return s;
  }
}